

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_md2012.c
# Opt level: O3

int gost_digest_ctrl_256(EVP_MD_CTX *ctx,int type,int arg,void *ptr)

{
  char *pcVar1;
  int iVar2;
  
  iVar2 = 0;
  if (type == 2) {
    pcVar1 = (char *)CRYPTO_malloc(0x13,
                                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_md2012.c"
                                   ,0x6c);
    *(char **)ptr = pcVar1;
    iVar2 = 0;
    if (pcVar1 != (char *)0x0) {
      builtin_strncpy(pcVar1,"gostr3411-2012-256",0x13);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int gost_digest_ctrl_256(EVP_MD_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_MD_CTRL_MICALG:
        {
            *((char **)ptr) = OPENSSL_malloc(strlen(micalg_256) + 1);
            if (*((char **)ptr) != NULL) {
                strcpy(*((char **)ptr), micalg_256);
                return 1;
            }
            return 0;
        }
    default:
        return 0;
    }
}